

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>::
createInstance(QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>
               *this,Context *context)

{
  Context *pCVar1;
  _func_int **pp_Var2;
  Context *pCVar3;
  VkResult result;
  TestInstance *pTVar4;
  VkPhysicalDeviceFeatures *pVVar5;
  StateObjects *pSVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  NotSupportedError *this_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VkQueryPoolCreateInfo queryPoolCreateInfo;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_78;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_60;
  string local_48;
  
  pTVar4 = (TestInstance *)operator_new(0x40);
  pTVar4->m_context = context;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__BasicOcclusionQueryTestInstance_00d5fb38;
  pCVar1 = *(Context **)&(this->m_testVector).queryWait;
  pp_Var2 = (_func_int **)(this->m_testVector).queryResultsStride;
  pCVar3 = *(Context **)&(this->m_testVector).queryResultsAvailability;
  pTVar4[1]._vptr_TestInstance = *(_func_int ***)&this->m_testVector;
  pTVar4[1].m_context = pCVar1;
  pTVar4[2]._vptr_TestInstance = pp_Var2;
  pTVar4[2].m_context = pCVar3;
  if (((ulong)pTVar4[1]._vptr_TestInstance & 1) != 0) {
    pVVar5 = Context::getDeviceFeatures(context);
    if (pVVar5->occlusionQueryPrecise == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Precise occlusion queries are not supported","");
      tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pSVar6 = (StateObjects *)operator_new(0x100);
  pDVar7 = Context::getDeviceInterface(pTVar4->m_context);
  StateObjects::StateObjects
            (pSVar6,pDVar7,pTVar4->m_context,3,
             *(VkPrimitiveTopology *)((long)&pTVar4[2].m_context + 4));
  pTVar4[3]._vptr_TestInstance = (_func_int **)pSVar6;
  pVVar8 = Context::getDevice(pTVar4->m_context);
  pDVar7 = Context::getDeviceInterface(pTVar4->m_context);
  local_48.field_2._M_allocated_capacity = 0;
  local_48.field_2._8_8_ = 2;
  local_48._M_dataplus._M_p = (pointer)0xb;
  local_48._M_string_length._0_4_ = 0;
  local_48._M_string_length._4_4_ = 0;
  result = (*pDVar7->_vptr_DeviceInterface[0x1e])(pDVar7,pVVar8,&local_48,0,&pTVar4[3].m_context);
  ::vk::checkResult(result,"vk.createQueryPool(device, &queryPoolCreateInfo, DE_NULL, &m_queryPool)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                    ,0x151);
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start + 3;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 0.0;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[0] = 0.0;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[1] = 0.0;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 0.0;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[0] = 0.5;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[1] = 0.5;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
  (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.5;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.5;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
  pSVar6 = (StateObjects *)pTVar4[3]._vptr_TestInstance;
  local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_60,&local_78);
  StateObjects::setVertices(pSVar6,pDVar7,&local_60);
  if (local_60.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar4;
}

Assistant:

vkt::TestInstance* createInstance (vkt::Context& context) const
	{
		return new Instance(context, m_testVector);
	}